

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRunSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fUseBuf;
  uint uVar2;
  uint fVerbose;
  uint fSkipMffc;
  uint fInputs;
  uint fFancy;
  uint fVeryVerbose;
  uint fUseWeights;
  uint fRandom;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  char *pFileNames [4];
  
  pFileNames[2] = "out.v";
  pFileNames[3] = (char *)0x0;
  pFileNames[0] = (char *)0x0;
  pFileNames[1] = (char *)0x0;
  local_a4 = 0;
  Extra_UtilGetoptReset();
  local_9c = 0xffffffff;
  local_a0 = 4;
  local_ac = 8;
  local_a8 = 0xffffffff;
  fFancy = 0;
  fUseBuf = 0;
  fRandom = 0;
  fUseWeights = 0;
  fInputs = 0;
  fSkipMffc = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"WBLUofbruimvwh"), iVar5 = globalUtilOptind,
        0x54 < iVar1) {
    switch(iVar1) {
    case 0x62:
      fUseBuf = fUseBuf ^ 1;
      break;
    case 99:
    case 100:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x74:
      goto switchD_00254b06_caseD_63;
    case 0x66:
      fFancy = fFancy ^ 1;
      break;
    case 0x69:
      fInputs = fInputs ^ 1;
      break;
    case 0x6d:
      fSkipMffc = fSkipMffc ^ 1;
      break;
    case 0x6f:
      local_a4 = local_a4 ^ 1;
      break;
    case 0x72:
      fRandom = fRandom ^ 1;
      break;
    case 0x75:
      fUseWeights = fUseWeights ^ 1;
      break;
    case 0x76:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x77:
      fVeryVerbose = fVeryVerbose ^ 1;
      break;
    default:
      if (iVar1 == 0x55) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-U\" should be followed by an integer.\n";
          goto LAB_00254d94;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_a8 = uVar2;
      }
      else {
        if (iVar1 != 0x57) goto switchD_00254b06_caseD_63;
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-W\" should be followed by an integer.\n";
LAB_00254d94:
          iVar5 = -1;
          goto LAB_00254d99;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_ac = uVar2;
      }
LAB_00254c5a:
      globalUtilOptind = iVar5 + 1;
      if ((int)uVar2 < 0) {
switchD_00254b06_caseD_63:
        Abc_Print(-2,"usage: runsim [-WBLU] [-ofbruimvwh] [-N <num>] <file1> <file2> <file3>\n");
        Abc_Print(-2,"\t           experimental simulation command\n");
        Abc_Print(-2,"\t-W <num> : the number of words of simulation info [default = %d]\n",
                  (ulong)local_ac);
        Abc_Print(-2,"\t-B <num> : the beam width parameter [default = %d]\n",(ulong)local_a0);
        Abc_Print(-2,"\t-L <num> : the lower bound on level [default = %d]\n",(ulong)local_9c);
        Abc_Print(-2,"\t-U <num> : the upper bound on level [default = %d]\n",(ulong)local_a8);
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (local_a4 == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-o       : toggle using a different node ordering [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fFancy == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-f       : toggle using experimental feature [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fUseBuf == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-b       : toggle using buffers [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fRandom == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,
                  "\t-r       : toggle using random permutation of support variables [default = %s]\n"
                  ,pcVar3);
        pcVar3 = "yes";
        if (fUseWeights == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,
                  "\t-u       : toggle using topological info to select support variables [default = %s]\n"
                  ,pcVar3);
        pcVar3 = "yes";
        if (fInputs == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,
                  "\t-i       : toggle using primary inputs as support variables [default = %s]\n",
                  pcVar3);
        pcVar3 = "yes";
        if (fSkipMffc == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-m       : toggle MFFC nodes as candidate divisors [default = %s]\n",pcVar3)
        ;
        pcVar3 = "yes";
        if (fVerbose == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar3);
        if (fVeryVerbose == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-w       : toggle printing more verbose information [default = %s]\n",pcVar4
                 );
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
    }
  }
  if (iVar1 == 0x42) {
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-B\" should be followed by an integer.\n";
      goto LAB_00254d94;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a0 = uVar2;
  }
  else {
    if (iVar1 != 0x4c) {
      if (iVar1 == -1) {
        if (0xfffffffc < (argc - globalUtilOptind) - 5U) {
          Gia_ManRandom(1);
          if (globalUtilOptind < argc) {
            memcpy(pFileNames,argv + globalUtilOptind,
                   (ulong)(uint)(~globalUtilOptind + argc) * 8 + 8);
          }
          if (globalUtilOptind - argc < -1) {
            lVar6 = 0;
            do {
              __stream = fopen(pFileNames[lVar6],"rb");
              if (__stream == (FILE *)0x0) {
                printf("Cannot open input file \"%s\".\n",pFileNames[lVar6]);
                return 0;
              }
              fclose(__stream);
              lVar6 = lVar6 + 1;
            } while (lVar6 < ~globalUtilOptind + argc);
          }
          Acb_NtkRunSim(pFileNames,local_ac,local_a0,local_9c,local_a8,local_a4,fFancy,fUseBuf,
                        fRandom,fUseWeights,fInputs,fSkipMffc,fVerbose,fVeryVerbose);
          return 0;
        }
        pcVar3 = "Expecting two or three file names on the command line.\n";
        iVar5 = 1;
LAB_00254d99:
        Abc_Print(iVar5,pcVar3);
      }
      goto switchD_00254b06_caseD_63;
    }
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_00254d94;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_9c = uVar2;
  }
  goto LAB_00254c5a;
}

Assistant:

int Abc_CommandRunSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Acb_NtkRunSim( char * pFileName[4], int nWords, int nBeam, int LevL, int LevU, int fOrder, int fFancy, int fUseBuf, int fRandom, int fUseWeights, int fInputs, int fSkipMffc, int fVerbose, int fVeryVerbose );
    char * pFileNames[4] = {NULL, NULL, "out.v", NULL};
    int c, nWords = 8, nBeam = 4, LevL = -1, LevU = -1, fOrder = 0, fFancy = 0, fUseBuf = 0, fRandom = 0, fUseWeights = 0, fInputs = 0, fSkipMffc = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WBLUofbruimvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            nBeam = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBeam < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            LevL = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LevL < 0 )
                goto usage;
            break;
        case 'U':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-U\" should be followed by an integer.\n" );
                goto usage;
            }
            LevU = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LevU < 0 )
                goto usage;
            break;
        case 'o':
            fOrder ^= 1;
            break;
        case 'f':
            fFancy ^= 1;
            break;
        case 'b':
            fUseBuf ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'u':
            fUseWeights ^= 1;
            break;
        case 'i':
            fInputs ^= 1;
            break;
        case 'm':
            fSkipMffc ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc - globalUtilOptind < 2 || argc - globalUtilOptind > 4 )
    {
        Abc_Print( 1, "Expecting two or three file names on the command line.\n" );
        goto usage;
    }
    Gia_ManRandom(1);
    for ( c = 0; c < argc - globalUtilOptind; c++ )
        pFileNames[c] = argv[globalUtilOptind+c];
    for ( c = 0; c < argc - globalUtilOptind - 1; c++ )
    {
        FILE * pFile = fopen( pFileNames[c], "rb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open input file \"%s\".\n", pFileNames[c] );
            return 0;
        }
        else
            fclose( pFile );
    }
    Acb_NtkRunSim( pFileNames, nWords, nBeam, LevL, LevU, fOrder, fFancy, fUseBuf, fRandom, fUseWeights, fInputs, fSkipMffc, fVerbose, fVeryVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: runsim [-WBLU] [-ofbruimvwh] [-N <num>] <file1> <file2> <file3>\n" );
    Abc_Print( -2, "\t           experimental simulation command\n" );
    Abc_Print( -2, "\t-W <num> : the number of words of simulation info [default = %d]\n", nWords );
    Abc_Print( -2, "\t-B <num> : the beam width parameter [default = %d]\n", nBeam );
    Abc_Print( -2, "\t-L <num> : the lower bound on level [default = %d]\n", LevL );
    Abc_Print( -2, "\t-U <num> : the upper bound on level [default = %d]\n", LevU );
    Abc_Print( -2, "\t-o       : toggle using a different node ordering [default = %s]\n", fOrder? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggle using experimental feature [default = %s]\n",      fFancy? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggle using buffers [default = %s]\n",                   fUseBuf? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle using random permutation of support variables [default = %s]\n",      fRandom? "yes": "no" );
    Abc_Print( -2, "\t-u       : toggle using topological info to select support variables [default = %s]\n", fUseWeights? "yes": "no" );
    Abc_Print( -2, "\t-i       : toggle using primary inputs as support variables [default = %s]\n",          fInputs? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggle MFFC nodes as candidate divisors [default = %s]\n",                   fSkipMffc? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n",                       fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing more verbose information [default = %s]\n",                  fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}